

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O2

uchar RC(uchar c)

{
  uchar uVar1;
  undefined3 in_register_00000039;
  int iVar2;
  
  iVar2 = CONCAT31(in_register_00000039,c);
  uVar1 = 'T';
  if (iVar2 == 0x41) {
    return 'T';
  }
  if (iVar2 == 0x43) {
    return 'G';
  }
  if (iVar2 == 0x47) {
    return 'C';
  }
  if (iVar2 == 0x54) {
    return 'A';
  }
  if (iVar2 != 0x61) {
    if (iVar2 == 0x74) {
      return 'A';
    }
    if (iVar2 == 0x67) {
      return 'C';
    }
    if (iVar2 == 99) {
      return 'G';
    }
    uVar1 = 'N';
  }
  return uVar1;
}

Assistant:

unsigned char RC(unsigned char c){

	switch(c){

		case 'A': case 'a': return 'T'; break;
		case 'C': case 'c': return 'G'; break;
		case 'G': case 'g': return 'C'; break;
		case 'T': case 't': return 'A'; break;
		default: break;

	}

	return 'N';

}